

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cpp
# Opt level: O2

wstring * skiwi::convert_string_to_wstring(wstring *__return_storage_ptr__,string *str)

{
  utf_error uVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  end;
  uint32_t cp;
  const_iterator it;
  uint32_t local_2c;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::__cxx11::wstring::reserve((ulong)__return_storage_ptr__);
  local_28._M_current = (str->_M_dataplus)._M_p;
  end._M_current = local_28._M_current + str->_M_string_length;
  while (local_28._M_current != end._M_current) {
    local_2c = 0;
    uVar1 = utf8::internal::
            validate_next<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (&local_28,end,&local_2c);
    if (uVar1 == UTF8_OK) {
      std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
    }
    else {
      std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
      local_28._M_current = local_28._M_current + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring convert_string_to_wstring(const std::string& str)
  {
  std::wstring out;
  out.reserve(str.size());
  auto it = str.begin();
  auto it_end = str.end();

  for (; it != it_end;)
    {
    uint32_t cp = 0;
    utf8::internal::utf_error err_code = utf8::internal::validate_next(it, it_end, cp);
    if (err_code == utf8::internal::UTF8_OK)
      {
      out.push_back((wchar_t)cp);
      }
    else
      {
      out.push_back(*it);
      ++it;
      }
    }
  return out;
  }